

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_kernel_c.h
# Opt level: O2

void __thiscall
dlib::
map_kernel_c<dlib::map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
::remove_any(map_kernel_c<dlib::map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
             *this,domain *d,range *r)

{
  uint *puVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  fatal_error *this_00;
  string local_1c0;
  ostringstream dlib_o_out;
  uint auStack_188 [88];
  
  iVar2 = (*(this->
            super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
            ).
            super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>_>_>
            ._vptr_enumerable[8])();
  if ((d != (domain *)r) && (CONCAT44(extraout_var,iVar2) != 0)) {
    binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::remove_any(&(this->
                  super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                  ).bst,d,r);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x8e);
  std::operator<<(poVar3,".\n");
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/logger/../threads/../map/map_kernel_c.h"
                          );
  std::operator<<(poVar3,".\n");
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
  poVar3 = std::operator<<(poVar3,
                           "virtual void dlib::map_kernel_c<dlib::map_kernel_1<std::basic_string<char>, std::unique_ptr<dlib::logger::global_data::output_streambuf_container>, dlib::binary_search_tree_kernel_2<std::basic_string<char>, std::unique_ptr<dlib::logger::global_data::output_streambuf_container>, dlib::memory_manager_stateless_kernel_1<char>>>>::remove_any(domain &, range &) [map_base = dlib::map_kernel_1<std::basic_string<char>, std::unique_ptr<dlib::logger::global_data::output_streambuf_container>, dlib::binary_search_tree_kernel_2<std::basic_string<char>, std::unique_ptr<dlib::logger::global_data::output_streambuf_container>, dlib::memory_manager_stateless_kernel_1<char>>>]"
                          );
  std::operator<<(poVar3,".\n\n");
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
  poVar3 = std::operator<<(poVar3,
                           "(this->size() > 0) && (static_cast<void*>(&d) != static_cast<void*>(&r))"
                          );
  std::operator<<(poVar3,".\n");
  puVar1 = (uint *)((long)auStack_188 + *(long *)(_dlib_o_out + -0x18));
  *puVar1 = *puVar1 | 1;
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"\tvoid map::remove_any");
  poVar3 = std::operator<<(poVar3,
                           "\n\tsize() must be greater than zero if something is going to be removed"
                          );
  poVar3 = std::operator<<(poVar3,"\n\tand d and r must not be the same variable.");
  poVar3 = std::operator<<(poVar3,"\n\tsize(): ");
  (*(this->
    super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
    ).
    super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>_>_>
    ._vptr_enumerable[8])(this);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"\n\tthis:   ");
  poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
  poVar3 = std::operator<<(poVar3,"\n\t&d:     ");
  poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
  poVar3 = std::operator<<(poVar3,"\n\t&r:     ");
  poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
  std::operator<<(poVar3,"\n");
  this_00 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_00,EBROKEN_ASSERT,&local_1c0);
  __cxa_throw(this_00,&fatal_error::typeinfo,error::~error);
}

Assistant:

void map_kernel_c<map_base>::
    remove_any (
        domain& d,
        range& r
    )
    {
        // make sure requires clause is not broken
        DLIB_CASSERT( (this->size() > 0)  &&
                (static_cast<void*>(&d) != static_cast<void*>(&r)),
            "\tvoid map::remove_any"
            << "\n\tsize() must be greater than zero if something is going to be removed"
            << "\n\tand d and r must not be the same variable."
            << "\n\tsize(): " << this->size() 
            << "\n\tthis:   " << this
            << "\n\t&d:     " << static_cast<void*>(&d)
            << "\n\t&r:     " << static_cast<void*>(&r)
            );

        // call the real function
        map_base::remove_any(d,r);
    }